

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::FieldBase::~FieldBase(FieldBase *this)

{
  ~FieldBase(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~FieldBase() {}